

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O0

int Ssw_SecWithSimilarityPairs(Aig_Man_t *p0,Aig_Man_t *p1,Vec_Int_t *vPairs,Ssw_Pars_t *pPars)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Aig_Man_t *p;
  abctime aVar6;
  abctime clk;
  int RetValue;
  Aig_Man_t *pAigRes;
  Ssw_Pars_t Pars;
  Ssw_Pars_t *pPars_local;
  Vec_Int_t *vPairs_local;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  Pars.pFunc = pPars;
  aVar5 = Abc_Clock();
  if (Pars.pFunc == (void *)0x0) {
    Pars.pFunc = &pAigRes;
    Ssw_ManSetDefaultParams((Ssw_Pars_t *)&pAigRes);
  }
  p = Ssw_SecWithSimilaritySweep(p0,p1,vPairs,(Ssw_Pars_t *)Pars.pFunc);
  iVar1 = Ssw_MiterStatus(p,1);
  if (iVar1 == 1) {
    Abc_Print(1,"Verification successful.  ");
  }
  else if (iVar1 == 0) {
    Abc_Print(1,"Verification failed with a counter-example.  ");
  }
  else {
    uVar2 = Aig_ManRegNum(p);
    iVar3 = Aig_ManRegNum(p0);
    iVar4 = Aig_ManRegNum(p1);
    Abc_Print(1,"Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
              (ulong)uVar2,(ulong)(uint)(iVar3 + iVar4));
  }
  Abc_Print(1,"%s =","Time");
  aVar6 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
  Aig_ManStop(p);
  return iVar1;
}

Assistant:

int Ssw_SecWithSimilarityPairs( Aig_Man_t * p0, Aig_Man_t * p1, Vec_Int_t * vPairs, Ssw_Pars_t * pPars )
{
    Ssw_Pars_t Pars;
    Aig_Man_t * pAigRes;
    int RetValue;
    abctime clk = Abc_Clock();
    // derive parameters if not given
    if ( pPars == NULL )
        Ssw_ManSetDefaultParams( pPars = &Pars );
    // reduce the AIG with pairs
    pAigRes = Ssw_SecWithSimilaritySweep( p0, p1, vPairs, pPars );
    // report the result of verification
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with a counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(p0)+Aig_ManRegNum(p1) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    Aig_ManStop( pAigRes );
    return RetValue;
}